

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O0

void __thiscall cmm::ReturnStatementAST::dump(ReturnStatementAST *this,string *prefix)

{
  bool bVar1;
  ostream *poVar2;
  pointer pEVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *prefix_local;
  ReturnStatementAST *this_local;
  
  local_18 = prefix;
  prefix_local = (string *)this;
  std::operator<<((ostream *)&std::cout,"return\n");
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->ReturnValue);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)local_18);
    std::operator<<(poVar2,"`---");
    pEVar3 = std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>::
             operator->(&this->ReturnValue);
    std::operator+(&local_38,local_18,"    ");
    (*(pEVar3->super_AST)._vptr_AST[2])(pEVar3,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

void ReturnStatementAST::dump(const std::string &prefix) const {
  std::cout << "return\n";
  if (!ReturnValue)
    return;
  std::cout << prefix << "`---";
  ReturnValue->dump(prefix + "    ");
}